

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Prog * __thiscall re2::Compiler::Finish(Compiler *this)

{
  bool bVar1;
  int iVar2;
  PODArray<re2::Prog::Inst> *in_RDI;
  Prog *p;
  int64_t m;
  Prog *in_stack_00000140;
  Prog *in_stack_00000280;
  Prog *in_stack_00000500;
  PODArray<re2::Prog::Inst> *in_stack_ffffffffffffffe0;
  Inst *local_18;
  Prog *local_8;
  
  if ((*(byte *)&in_RDI[2].ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> & 1) == 0) {
    iVar2 = Prog::start((Prog *)in_RDI[1].ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl);
    if ((iVar2 == 0) &&
       (iVar2 = Prog::start_unanchored
                          ((Prog *)in_RDI[1].ptr_._M_t.
                                   super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                   .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl),
       iVar2 == 0)) {
      in_RDI[4].ptr_._M_t.
      super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
      super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
      super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
      super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> =
           (_Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>)0x1;
    }
    PODArray<re2::Prog::Inst>::operator=(in_stack_ffffffffffffffe0,in_RDI);
    in_RDI[1].ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl[2].out_opcode_ =
         (uint32_t)
         in_RDI[4].ptr_._M_t.
         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
         super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
         super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>;
    Prog::Optimize(in_stack_00000140);
    Prog::Flatten(in_stack_00000280);
    Prog::ComputeByteMap(in_stack_00000500);
    if ((long)in_RDI[4].ptr_._M_t.
              super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
              super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
              super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl < 1) {
      Prog::set_dfa_mem((Prog *)in_RDI[1].ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,
                        0x100000);
    }
    else {
      local_18 = in_RDI[4].ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl +
                 (-0x34 - (long)(int)in_RDI[1].ptr_._M_t.
                                     super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                     .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl
                                     [2].out_opcode_);
      bVar1 = Prog::CanBitState((Prog *)0x2312f3);
      if (bVar1) {
        local_18 = (Inst *)((long)local_18 +
                           (long)(int)in_RDI[1].ptr_._M_t.
                                      super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                      .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl
                                      [2].out_opcode_ * -2);
      }
      if ((long)local_18 < 0) {
        local_18 = (Inst *)0x0;
      }
      Prog::set_dfa_mem((Prog *)in_RDI[1].ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,
                        (int64_t)local_18);
    }
    local_8 = (Prog *)in_RDI[1].ptr_._M_t.
                      super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                      .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    in_RDI[1].ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl = (Inst *)0x0;
  }
  else {
    local_8 = (Prog *)0x0;
  }
  return local_8;
}

Assistant:

Prog* Compiler::Finish() {
  if (failed_)
    return NULL;

  if (prog_->start() == 0 && prog_->start_unanchored() == 0) {
    // No possible matches; keep Fail instruction only.
    ninst_ = 1;
  }

  // Hand off the array to Prog.
  prog_->inst_ = std::move(inst_);
  prog_->size_ = ninst_;

  prog_->Optimize();
  prog_->Flatten();
  prog_->ComputeByteMap();

  // Record remaining memory for DFA.
  if (max_mem_ <= 0) {
    prog_->set_dfa_mem(1<<20);
  } else {
    int64_t m = max_mem_ - sizeof(Prog);
    m -= prog_->size_*sizeof(Prog::Inst);  // account for inst_
    if (prog_->CanBitState())
      m -= prog_->size_*sizeof(uint16_t);  // account for list_heads_
    if (m < 0)
      m = 0;
    prog_->set_dfa_mem(m);
  }

  Prog* p = prog_;
  prog_ = NULL;
  return p;
}